

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::BuiltinPrecisionTests::FuncCaseBase::iterate(FuncCaseBase *this)

{
  string *__rhs;
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = glu::ContextInfo::create((this->super_PrecisionCase).m_ctx.renderContext);
  if ((this->super_PrecisionCase).m_extension._M_string_length != 0) {
    __rhs = &(this->super_PrecisionCase).m_extension;
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,(__rhs->_M_dataplus)._M_p);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::operator+(&local_40,"Unsupported extension: ",__rhs);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (*(this->super_PrecisionCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  tcu::ResultCollector::setTestContextResult
            (&(this->super_PrecisionCase).m_status,
             (this->super_PrecisionCase).super_TestCase.super_TestNode.m_testCtx);
  if (this_00 != (ContextInfo *)0x0) {
    (*this_00->_vptr_ContextInfo[1])(this_00);
  }
  return STOP;
}

Assistant:

IterateResult FuncCaseBase::iterate (void)
{
	MovePtr<ContextInfo>	info	(ContextInfo::create(getRenderContext()));

	if (!m_extension.empty() && !info->isExtensionSupported(m_extension.c_str()))
		throw NotSupportedError("Unsupported extension: " + m_extension);

	runTest();

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}